

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void __thiscall asmjit::ZoneHashBase::reset(ZoneHashBase *this,ZoneHeap *heap)

{
  uint32_t newCount;
  Slot *pSVar1;
  Zone *pZVar2;
  Slot *pSVar3;
  uint uVar4;
  Slot *pSVar5;
  uint32_t *puVar6;
  ZoneHeap *pZVar7;
  size_t in_RDX;
  ulong extraout_RDX;
  Slot *pSVar8;
  ulong uVar9;
  int iVar10;
  ZoneHeap *this_00;
  ZoneHeap *this_01;
  ZoneHeap *this_02;
  size_t sStack_40;
  ZoneHashBase *pZStack_38;
  
  this_00 = (ZoneHeap *)this->_data;
  if (this_00 == (ZoneHeap *)this->_embedded) {
LAB_00119b26:
    this->_heap = heap;
    this->_size = 0;
    this->_bucketsCount = 1;
    this->_bucketsGrow = 1;
    this->_data = this->_embedded;
    this->_embedded[0] = (ZoneHashNode *)0x0;
    return;
  }
  this_01 = this->_heap;
  if (this_01->_zone == (Zone *)0x0) {
    reset();
LAB_00119b50:
    reset();
  }
  else {
    if (this_00 == (ZoneHeap *)0x0) goto LAB_00119b50;
    uVar4 = this->_bucketsCount;
    if (uVar4 != 0) {
      if (uVar4 < 0x41) {
        if (uVar4 < 0x11) {
          uVar4 = (uint)((ulong)uVar4 * 8 + 0x1fffffffff >> 5);
        }
        else {
          uVar4 = (int)((ulong)uVar4 * 8 + 0x3fffffff7f >> 6) + 4;
        }
        this_00->_zone = (Zone *)this_01->_slots[uVar4];
        this_01->_slots[uVar4] = (Slot *)this_00;
      }
      else {
        ZoneHeap::_releaseDynamic(this_01,this_00,in_RDX);
      }
      goto LAB_00119b26;
    }
  }
  reset();
  this_02 = (ZoneHeap *)this_01->_zone;
  pZStack_38 = this;
  if (this_02 == (ZoneHeap *)0x0) {
    _rehash();
LAB_00119c40:
    _rehash();
LAB_00119c45:
    _rehash();
  }
  else {
    if (this_02->_zone == (Zone *)0x0) goto LAB_00119c40;
    iVar10 = (int)this_00;
    pSVar8 = this_01->_slots[2];
    pSVar5 = (Slot *)ZoneHeap::_allocZeroed(this_02,((ulong)this_00 & 0xffffffff) << 3,&sStack_40);
    if (pSVar5 == (Slot *)0x0) {
      return;
    }
    uVar4 = *(uint *)(this_01->_slots + 1);
    this_02 = (ZoneHeap *)(ulong)uVar4;
    uVar9 = extraout_RDX;
    if (this_02 != (ZoneHeap *)0x0) {
      pZVar7 = (ZoneHeap *)0x0;
      do {
        pSVar3 = pSVar8[(long)pZVar7].next;
        while (pSVar3 != (Slot *)0x0) {
          pSVar1 = pSVar3->next;
          uVar9 = (ulong)*(uint *)&pSVar3[1].next % ((ulong)this_00 & 0xffffffff);
          pSVar3->next = pSVar5[uVar9].next;
          pSVar5[uVar9].next = pSVar3;
          pSVar3 = pSVar1;
        }
        pZVar7 = (ZoneHeap *)((long)&pZVar7->_zone + 1);
      } while (pZVar7 != this_02);
    }
    if (pSVar8 == (Slot *)(this_01->_slots + 3)) {
LAB_00119c01:
      *(int *)(this_01->_slots + 1) = iVar10;
      *(uint *)((long)this_01->_slots + 0xc) = (uint)(iVar10 * 9) / 10;
      this_01->_slots[2] = pSVar5;
      return;
    }
    this_00 = (ZoneHeap *)this_01->_zone;
    if (this_00->_zone == (Zone *)0x0) goto LAB_00119c45;
    if (pSVar8 != (Slot *)0x0) {
      if (this_02 != (ZoneHeap *)0x0) {
        if (uVar4 < 0x41) {
          _rehash();
        }
        else {
          ZoneHeap::_releaseDynamic(this_00,pSVar8,uVar9);
        }
        goto LAB_00119c01;
      }
      goto LAB_00119c4f;
    }
  }
  _rehash();
LAB_00119c4f:
  _rehash();
  uVar4 = *(uint *)(this_02->_slots + 1);
  uVar9 = (ulong)*(uint *)this_00->_slots % (ulong)uVar4;
  pSVar8 = this_02->_slots[2];
  pZVar2 = (Zone *)pSVar8[uVar9].next;
  this_00->_zone = pZVar2;
  pSVar8[uVar9].next = (Slot *)this_00;
  pSVar8 = (Slot *)((long)&this_02->_slots[0]->next + 1);
  this_02->_slots[0] = pSVar8;
  if (((Slot *)(ulong)*(uint *)((long)this_02->_slots + 0xc) <= pSVar8) && (pZVar2 != (Zone *)0x0))
  {
    puVar6 = &ZoneHash_getClosestPrime(unsigned_int)::primeTable;
    uVar9 = 0;
    do {
      newCount = *puVar6;
      if (8 < uVar9) break;
      uVar9 = uVar9 + 1;
      puVar6 = puVar6 + 1;
    } while (newCount <= uVar4);
    if (newCount != uVar4) {
      _rehash((ZoneHashBase *)this_02,newCount);
    }
  }
  return;
}

Assistant:

void ZoneHashBase::reset(ZoneHeap* heap) noexcept {
  ZoneHashNode** oldData = _data;
  if (oldData != _embedded)
    _heap->release(oldData, _bucketsCount * sizeof(ZoneHashNode*));

  _heap = heap;
  _size = 0;
  _bucketsCount = 1;
  _bucketsGrow = 1;
  _data = _embedded;
  _embedded[0] = nullptr;
}